

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

uint128 * __thiscall trng::portable_impl::uint128::operator/=(uint128 *this,uint128 other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  int i;
  bool bVar8;
  
  uVar2 = other.m_hi;
  uVar3 = other.m_lo;
  uVar6 = 0x80;
  uVar1 = 0;
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar1 = uVar1 << 1 | uVar5 >> 0x3f;
    uVar5 = (ulong)((this->m_hi >> (uVar6 - 0x41 & 0x3f) & 1) != 0) + uVar5 * 2;
    if ((uVar2 < uVar1) || ((uVar1 == uVar2 && (uVar3 <= uVar5)))) {
      bVar8 = uVar5 < uVar3;
      uVar5 = uVar5 - uVar3;
      uVar1 = (uVar1 - uVar2) - (ulong)bVar8;
      uVar4 = uVar4 | 1L << (uVar6 - 0x41 & 0x3f);
    }
    uVar6 = uVar6 - 1;
  } while (0x40 < uVar6);
  uVar6 = 0x3f;
  uVar7 = 0;
  do {
    uVar1 = uVar1 << 1 | uVar5 >> 0x3f;
    uVar5 = (ulong)((this->m_lo >> (uVar6 & 0x3f) & 1) != 0) + uVar5 * 2;
    if ((uVar2 < uVar1) || ((uVar1 == uVar2 && (uVar3 <= uVar5)))) {
      bVar8 = uVar5 < uVar3;
      uVar5 = uVar5 - uVar3;
      uVar1 = (uVar1 - uVar2) - (ulong)bVar8;
      uVar7 = uVar7 | 1L << (uVar6 & 0x3f);
    }
    bVar8 = uVar6 != 0;
    uVar6 = uVar6 - 1;
  } while (bVar8);
  this->m_lo = uVar7;
  this->m_hi = uVar4;
  return this;
}

Assistant:

uint128 &operator/=(uint128 other) {
        uint128 q;
        uint128 r;
        for (int i{127}; i >= 64; --i) {
          r <<= 1;
          r.m_lo |= (this->m_hi & (1ull << (i - 64))) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_hi |= 1ull << (i - 64);
          }
        }
        for (int i{63}; i >= 0; --i) {
          r <<= 1;
          r.m_lo |= (this->m_lo & (1ull << i)) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_lo |= 1ull << i;
          }
        }
        this->m_lo = q.m_lo;
        this->m_hi = q.m_hi;
        return *this;
      }